

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC1918(CNetAddr *this)

{
  long lVar1;
  bool bVar2;
  uchar *puVar3;
  byte *pbVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined5 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  bool bVar5;
  size_type pos;
  uint7 in_stack_ffffffffffffffe8;
  undefined1 uVar6;
  
  pos = (size_type)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsIPv4((CNetAddr *)
                 CONCAT17(in_stack_ffffffffffffffdf,
                          CONCAT16(in_stack_ffffffffffffffde,
                                   CONCAT15(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffd8))));
  uVar6 = false;
  bVar5 = (bool)uVar6;
  if (bVar2) {
    puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                        (ulong)in_stack_ffffffffffffffe8,pos);
    bVar5 = true;
    if (*puVar3 != '\n') {
      puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(uVar6,in_stack_ffffffffffffffe8),pos);
      if (*puVar3 == 0xc0) {
        puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(uVar6,in_stack_ffffffffffffffe8),pos);
        bVar5 = true;
        if (*puVar3 == 0xa8) goto LAB_00dfef06;
      }
      puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(uVar6,in_stack_ffffffffffffffe8),pos);
      bVar5 = false;
      if (*puVar3 == 0xac) {
        pbVar4 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(uVar6,in_stack_ffffffffffffffe8),pos);
        bVar5 = false;
        if (0xf < *pbVar4) {
          pbVar4 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                             ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                              CONCAT17(uVar6,in_stack_ffffffffffffffe8),pos);
          bVar5 = *pbVar4 < 0x20;
        }
      }
    }
  }
LAB_00dfef06:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CNetAddr::IsRFC1918() const
{
    return IsIPv4() && (
        m_addr[0] == 10 ||
        (m_addr[0] == 192 && m_addr[1] == 168) ||
        (m_addr[0] == 172 && m_addr[1] >= 16 && m_addr[1] <= 31));
}